

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O3

int __thiscall
CSound::Play(CSound *this,int ChannelID,CSampleHandle SampleID,int Flags,float x,float y)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  if (SampleID.m_Id < 0) {
    iVar3 = -1;
  }
  else {
    lock_wait(m_SoundLock);
    iVar3 = 0;
    do {
      uVar1 = m_NextVoice + iVar3;
      uVar4 = m_NextVoice + 0x3f + iVar3;
      if (-1 < (int)uVar1) {
        uVar4 = uVar1;
      }
      iVar2 = uVar1 - (uVar4 & 0xffffffc0);
      if (m_aVoices[iVar2].m_pSample == (CSample *)0x0) {
        m_NextVoice = iVar2 + 1;
        iVar3 = -1;
        if (m_NextVoice != 0) {
          m_aVoices[iVar2].m_pSample = m_aSamples + (uint)SampleID.m_Id;
          m_aVoices[iVar2].m_pChannel = m_aChannels + ChannelID;
          iVar3 = 0;
          if ((Flags & 1U) != 0) {
            iVar3 = m_aSamples[(uint)SampleID.m_Id].m_PausedAt;
          }
          m_aVoices[iVar2].m_Tick = iVar3;
          m_aVoices[iVar2].m_Vol = 0xff;
          m_aVoices[iVar2].m_Flags = Flags;
          m_aVoices[iVar2].m_X = (int)x;
          m_aVoices[iVar2].m_Y = (int)y;
          iVar3 = iVar2;
        }
        goto LAB_0012f203;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0x40);
    iVar3 = -1;
LAB_0012f203:
    lock_unlock(m_SoundLock);
  }
  return iVar3;
}

Assistant:

int CSound::Play(int ChannelID, CSampleHandle SampleID, int Flags, float x, float y)
{
	if(!SampleID.IsValid())
		return -1;

	int VoiceID = -1;
	int i;

	lock_wait(m_SoundLock);

	// search for voice
	for(i = 0; i < NUM_VOICES; i++)
	{
		int id = (m_NextVoice + i) % NUM_VOICES;
		if(!m_aVoices[id].m_pSample)
		{
			VoiceID = id;
			m_NextVoice = id+1;
			break;
		}
	}

	// voice found, use it
	if(VoiceID != -1)
	{
		m_aVoices[VoiceID].m_pSample = &m_aSamples[SampleID.Id()];
		m_aVoices[VoiceID].m_pChannel = &m_aChannels[ChannelID];
		if(Flags & FLAG_LOOP)
			m_aVoices[VoiceID].m_Tick = m_aSamples[SampleID.Id()].m_PausedAt;
		else
			m_aVoices[VoiceID].m_Tick = 0;
		m_aVoices[VoiceID].m_Vol = 255;
		m_aVoices[VoiceID].m_Flags = Flags;
		m_aVoices[VoiceID].m_X = (int)x;
		m_aVoices[VoiceID].m_Y = (int)y;
	}

	lock_unlock(m_SoundLock);
	return VoiceID;
}